

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_text.c
# Opt level: O3

void qlist_read(t_qlist *x,t_symbol *filename,t_symbol *format)

{
  byte bVar1;
  byte *pbVar2;
  int iVar3;
  uint crflag;
  
  pbVar2 = (byte *)format->s_name;
  bVar1 = *pbVar2;
  crflag = (uint)bVar1;
  if (bVar1 != 0) {
    if (((bVar1 == 99) && (pbVar2[1] == 0x72)) && (pbVar2[2] == 0)) {
      crflag = 1;
    }
    else {
      crflag = 0;
      pd_error(x,"qlist_read: unknown flag: %s");
    }
  }
  iVar3 = binbuf_read_via_canvas
                    ((x->x_textbuf).b_binbuf,filename->s_name,(x->x_textbuf).b_canvas,crflag);
  if (iVar3 != 0) {
    pd_error(x,"%s: read failed",filename->s_name);
  }
  x->x_onset = 0x7fffffff;
  x->x_rewound = 1;
  return;
}

Assistant:

static void qlist_read(t_qlist *x, t_symbol *filename, t_symbol *format)
{
    int cr = 0;
    if (!strcmp(format->s_name, "cr"))
        cr = 1;
    else if (*format->s_name)
        pd_error(x, "qlist_read: unknown flag: %s", format->s_name);

    if (binbuf_read_via_canvas(x->x_binbuf, filename->s_name, x->x_canvas, cr))
            pd_error(x, "%s: read failed", filename->s_name);
    x->x_onset = 0x7fffffff;
    x->x_rewound = 1;
}